

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O3

MPP_RET hal_h264e_vepu540c_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  MPP_RET MVar2;
  void *pvVar3;
  char *fmt;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  cfg->type = VPU_CLIENT_RKVENC;
  MVar2 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVENC);
  if (MVar2 == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    MVar2 = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (MVar2 == MPP_OK) {
      pMVar1 = cfg->cfg;
      (pMVar1->hw).qp_delta_row = 2;
      (pMVar1->hw).qp_delta_row_i = 1;
      (pMVar1->hw).qbias_i = 0x2ab;
      (pMVar1->hw).qbias_p = 0x155;
      (pMVar1->hw).qbias_en = 0;
      (pMVar1->hw).aq_thrd_i[0] = 0;
      (pMVar1->hw).aq_thrd_i[1] = 0;
      (pMVar1->hw).aq_thrd_i[2] = 0;
      (pMVar1->hw).aq_thrd_i[3] = 0;
      (pMVar1->hw).aq_thrd_i[4] = 3;
      (pMVar1->hw).aq_thrd_i[5] = 3;
      (pMVar1->hw).aq_thrd_i[6] = 5;
      (pMVar1->hw).aq_thrd_i[7] = 5;
      (pMVar1->hw).aq_thrd_i[8] = 8;
      (pMVar1->hw).aq_thrd_i[9] = 8;
      (pMVar1->hw).aq_thrd_i[10] = 8;
      (pMVar1->hw).aq_thrd_i[0xb] = 0xf;
      (pMVar1->hw).aq_thrd_i[0xc] = 0xf;
      (pMVar1->hw).aq_thrd_i[0xd] = 0x14;
      (pMVar1->hw).aq_thrd_i[0xe] = 0x19;
      (pMVar1->hw).aq_thrd_i[0xf] = 0x19;
      (pMVar1->hw).aq_thrd_p[0] = 0;
      (pMVar1->hw).aq_thrd_p[1] = 0;
      (pMVar1->hw).aq_thrd_p[2] = 0;
      (pMVar1->hw).aq_thrd_p[3] = 0;
      (pMVar1->hw).aq_thrd_p[4] = 3;
      (pMVar1->hw).aq_thrd_p[5] = 3;
      (pMVar1->hw).aq_thrd_p[6] = 5;
      (pMVar1->hw).aq_thrd_p[7] = 5;
      (pMVar1->hw).aq_thrd_p[8] = 8;
      (pMVar1->hw).aq_thrd_p[9] = 8;
      (pMVar1->hw).aq_thrd_p[10] = 8;
      (pMVar1->hw).aq_thrd_p[0xb] = 0xf;
      (pMVar1->hw).aq_thrd_p[0xc] = 0xf;
      (pMVar1->hw).aq_thrd_p[0xd] = 0x14;
      (pMVar1->hw).aq_thrd_p[0xe] = 0x19;
      (pMVar1->hw).aq_thrd_p[0xf] = 0x19;
      (pMVar1->hw).aq_step_i[0xc] = 4;
      (pMVar1->hw).aq_step_i[0xd] = 5;
      (pMVar1->hw).aq_step_i[0xe] = 8;
      (pMVar1->hw).aq_step_i[0xf] = 8;
      (pMVar1->hw).aq_step_i[8] = 0;
      (pMVar1->hw).aq_step_i[9] = 1;
      (pMVar1->hw).aq_step_i[10] = 2;
      (pMVar1->hw).aq_step_i[0xb] = 3;
      (pMVar1->hw).aq_step_i[4] = -4;
      (pMVar1->hw).aq_step_i[5] = -3;
      (pMVar1->hw).aq_step_i[6] = -2;
      (pMVar1->hw).aq_step_i[7] = -1;
      (pMVar1->hw).aq_step_i[0] = -8;
      (pMVar1->hw).aq_step_i[1] = -7;
      (pMVar1->hw).aq_step_i[2] = -6;
      (pMVar1->hw).aq_step_i[3] = -5;
      (pMVar1->hw).aq_step_p[0xc] = 4;
      (pMVar1->hw).aq_step_p[0xd] = 5;
      (pMVar1->hw).aq_step_p[0xe] = 7;
      (pMVar1->hw).aq_step_p[0xf] = 8;
      (pMVar1->hw).aq_step_p[8] = 0;
      (pMVar1->hw).aq_step_p[9] = 1;
      (pMVar1->hw).aq_step_p[10] = 2;
      (pMVar1->hw).aq_step_p[0xb] = 3;
      (pMVar1->hw).aq_step_p[4] = -4;
      (pMVar1->hw).aq_step_p[5] = -3;
      (pMVar1->hw).aq_step_p[6] = -2;
      (pMVar1->hw).aq_step_p[7] = -1;
      (pMVar1->hw).aq_step_p[0] = -8;
      (pMVar1->hw).aq_step_p[1] = -7;
      (pMVar1->hw).aq_step_p[2] = -6;
      (pMVar1->hw).aq_step_p[3] = -5;
      pvVar3 = mpp_osal_calloc("hal_h264e_vepu540c_init",0x15c8);
      *(void **)((long)hal + 0x160) = pvVar3;
      MVar2 = MPP_OK;
      if (pvVar3 == (void *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu540c","HalVepu540cRegSet alloc fail",(char *)0x0);
        return MPP_ERR_MALLOC;
      }
      goto LAB_00223dac;
    }
    fmt = "init vepu buffer failed ret: %d\n";
  }
  else {
    fmt = "mpp_dev_init failed. ret: %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu540c",fmt,"hal_h264e_vepu540c_init",(ulong)(uint)MVar2);
  hal_h264e_vepu540c_deinit(hal);
LAB_00223dac:
  h264e_vepu_stream_amend_init((HalH264eVepuStreamAmend *)((long)hal + 0x70));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_init",hal);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu540cCtx *p = (HalH264eVepu540cCtx *)hal;
    MPP_RET ret = MPP_OK;
    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 1;
        hw->qp_delta_row    = 2;
        hw->qbias_i = 683;
        hw->qbias_p = 341;
        hw->qbias_en = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));
    }

    p->regs_set = mpp_calloc(HalVepu540cRegSet, 1);

    if (!p->regs_set) {
        mpp_err("HalVepu540cRegSet alloc fail");
        return MPP_ERR_MALLOC;
    }

DONE:
    if (ret)
        hal_h264e_vepu540c_deinit(hal);

    h264e_vepu_stream_amend_init(&p->amend);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}